

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O1

string * __thiscall
duckdb::Binder::BindCatalog(string *__return_storage_ptr__,Binder *this,string *catalog)

{
  pointer pcVar1;
  string *psVar2;
  DatabaseManager *this_00;
  optional_ptr<duckdb::AttachedDatabase,_true> oVar3;
  string *psVar4;
  
  this_00 = DatabaseManager::Get(this->context);
  oVar3 = DatabaseManager::GetDatabase(this_00,this->context,catalog);
  if (oVar3.ptr == (AttachedDatabase *)0x0) {
    psVar4 = DatabaseManager::GetDefaultDatabase_abi_cxx11_(this->context);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar2 = psVar4;
  }
  else {
    oVar3 = DatabaseManager::GetDatabase(this_00,this->context,catalog);
    psVar4 = &((oVar3.ptr)->super_CatalogEntry).name;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar2 = &((oVar3.ptr)->super_CatalogEntry).name;
  }
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

const string Binder::BindCatalog(string &catalog) {
	auto &db_manager = DatabaseManager::Get(context);
	optional_ptr<AttachedDatabase> database = db_manager.GetDatabase(context, catalog);
	if (database) {
		return db_manager.GetDatabase(context, catalog).get()->GetName();
	} else {
		return db_manager.GetDefaultDatabase(context);
	}
}